

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  sxi32 sVar3;
  char *zMask_00;
  char *pcVar4;
  int iUserlen;
  char *zBase;
  int nOfft;
  int rc;
  int iCount;
  SyString sToken;
  int iLen;
  int iMasklen;
  char *zEnd;
  char *zMask;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  nOfft = 0;
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_int(pCtx,0);
  }
  else {
    zMask = jx9_value_to_string(*apArg,(int *)&sToken.nByte);
    zMask_00 = jx9_value_to_string(*(jx9_value **)(zString + 8),(int *)&sToken.field_0xc);
    if (((int)sToken.nByte < 1) || ((int)sToken._12_4_ < 1)) {
      jx9_result_int(pjStack_18,0);
    }
    else {
      if (2 < apArg_local._4_4_) {
        iVar1 = jx9_value_to_int(*(jx9_value **)(zString + 0x10));
        if (iVar1 < 0) {
          pcVar4 = zMask + (int)(sToken.nByte + iVar1);
          if (pcVar4 <= zMask) {
            jx9_result_int(pjStack_18,0);
            return 0;
          }
          sToken.nByte = ((int)zMask + sToken.nByte) - (int)pcVar4;
          zMask = pcVar4;
        }
        else {
          if ((int)sToken.nByte <= iVar1) {
            jx9_result_int(pjStack_18,0);
            return 0;
          }
          zMask = zMask + iVar1;
          sToken.nByte = sToken.nByte - iVar1;
        }
        if (((3 < apArg_local._4_4_) &&
            (uVar2 = jx9_value_to_int(*(jx9_value **)(zString + 0x18)), 0 < (int)uVar2)) &&
           ((int)uVar2 < (int)sToken.nByte)) {
          sToken.nByte = uVar2;
        }
      }
      sVar3 = ExtractNonSpaceToken(&zMask,zMask + (int)sToken.nByte,(SyString *)&rc);
      if ((sVar3 == 0) && ((int)sToken.zString != 0)) {
        nOfft = LongestStringMask(_rc,(int)sToken.zString,zMask_00,sToken._12_4_);
      }
      jx9_result_int(pjStack_18,nOfft);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 || iMasklen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}